

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O0

void distorm_format_size(uchar **str,_DInst *di,int opNum)

{
  uint16_t uVar1;
  bool bVar2;
  int isSizingRequired;
  int opNum_local;
  _DInst *di_local;
  uchar **str_local;
  
  bVar2 = true;
  if (((opNum < 2) && (bVar2 = false, opNum == 0)) && (bVar2 = false, di->ops[0].type != '\x01')) {
    bVar2 = di->ops[1].type != '\x01';
  }
  if ((!bVar2) &&
     (((((uVar1 = di->opcode, uVar1 == 0x7b || (uVar1 == 0x80)) ||
        ((uVar1 == 0x36c || ((uVar1 == 0x37c || (uVar1 == 0x39f)))))) ||
       ((uVar1 == 0x3ab ||
        ((((((uVar1 == 0x3c7 || (uVar1 == 0x3cc)) || (uVar1 == 0x3d1)) ||
           ((uVar1 == 0x3d6 || (uVar1 == 0x3db)))) ||
          ((uVar1 == 0x3e0 || ((uVar1 == 0x3e5 || (uVar1 == 0x3ea)))))) || (uVar1 == 0x9df)))))) ||
      (uVar1 == 0x272b)))) {
    bVar2 = true;
  }
  if (bVar2) {
    switch(di->ops[opNum].size >> 3) {
    case 1:
      builtin_memcpy(*str,"BYTE    ",8);
      *str = *str + 5;
      break;
    case 2:
      builtin_memcpy(*str,"WORD    ",8);
      *str = *str + 5;
      break;
    case 4:
      builtin_memcpy(*str,"DWORD   ",8);
      *str = *str + 6;
      break;
    case 8:
      builtin_memcpy(*str,"QWORD   ",8);
      *str = *str + 6;
      break;
    case 10:
      builtin_memcpy(*str,"TBYTE   ",8);
      *str = *str + 6;
      break;
    case 0x10:
      builtin_memcpy(*str,"DQWORD  ",8);
      *str = *str + 7;
      break;
    case 0x20:
      builtin_memcpy(*str,"YWORD   ",8);
      *str = *str + 6;
    }
  }
  return;
}

Assistant:

static void distorm_format_size(unsigned char** str, const _DInst* di, int opNum)
{
	int isSizingRequired = 0;
	/*
	 * We only have to output the size explicitly if it's not clear from the operands.
	 * For example:
	 * mov al, [0x1234] -> The size is 8, we know it from the AL register operand.
	 * mov [0x1234], 0x11 -> Now we don't know the size. Pam pam pam
	 *
	 * If given operand number is higher than 2, then output the size anyways.
	 */
	isSizingRequired = ((opNum >= 2) || ((opNum == 0) && (di->ops[0].type != O_REG) && (di->ops[1].type != O_REG)));

	/* Still not sure? Try some special instructions. */
	if (!isSizingRequired) {
		/*
		 * INS/OUTS are exception, because DX is a port specifier and not a real src/dst register.
		 * A few exceptions that always requires sizing:
		 * MOVZX, MOVSX, MOVSXD.
		 * ROL, ROR, RCL, RCR, SHL, SHR, SAL, SAR.
		 * SHLD, SHRD.
		 * CVTSI2SS is also an exception.
		 */
		switch (di->opcode)
		{
			case I_INS:
			case I_OUTS:
			case I_MOVZX:
			case I_MOVSX:
			case I_MOVSXD:
			case I_ROL:
			case I_ROR:
			case I_RCL:
			case I_RCR:
			case I_SHL:
			case I_SHR:
			case I_SAL:
			case I_SAR:
			case I_SHLD:
			case I_SHRD:
			case I_CVTSI2SS:
				isSizingRequired = 1;
			break;
			default: /* Instruction doesn't require sizing. */ break;
		}
	}

	if (isSizingRequired)
	{
		/*case 0: break; OT_MEM's unknown size. */
		switch (di->ops[opNum].size / 8)
		{
			case 1: strcat_WS(*str,  "BYTE    ", 8, 5); break;
			case 2: strcat_WS(*str,  "WORD    ", 8, 5); break;
			case 4: strcat_WS(*str,  "DWORD   ", 8, 6); break;
			case 8: strcat_WS(*str,  "QWORD   ", 8, 6); break;
			case 10: strcat_WS(*str, "TBYTE   ", 8, 6); break;
			case 16: strcat_WS(*str, "DQWORD  ", 8, 7); break;
			case 32: strcat_WS(*str, "YWORD   ", 8, 6); break;
		}
	}
}